

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cpp
# Opt level: O0

void __thiscall RVO::KdTree::buildAgentTree(KdTree *this)

{
  bool bVar1;
  size_type sVar2;
  KdTree *this_local;
  
  std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator=
            (&this->agents_,&this->sim_->agents_);
  bVar1 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::empty(&this->agents_);
  if (!bVar1) {
    sVar2 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(&this->agents_);
    std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::resize
              (&this->agentTree_,sVar2 * 2 - 1);
    sVar2 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(&this->agents_);
    buildAgentTreeRecursive(this,0,sVar2,0);
  }
  return;
}

Assistant:

void KdTree::buildAgentTree()
	{
		agents_ = sim_->agents_;

		if (!agents_.empty()) {
			agentTree_.resize(2 * agents_.size() - 1);
			buildAgentTreeRecursive(0, agents_.size(), 0);
		}
	}